

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::FILERawSink::Write(FILERawSink *this,string_view v)

{
  bool bVar1;
  int iVar2;
  const_pointer __ptr;
  size_type __n;
  size_t __n_00;
  int *piVar3;
  bool bVar4;
  size_t result;
  FILERawSink *pFStack_20;
  ClearErrnoGuard guard;
  FILERawSink *this_local;
  string_view v_local;
  
  v_local._M_len = (size_t)v._M_str;
  this_local = (FILERawSink *)v._M_len;
  pFStack_20 = this;
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    bVar4 = false;
    if (!bVar1) {
      bVar4 = this->error_ == 0;
    }
    if (!bVar4) break;
    str_format_internal::anon_unknown_0::ClearErrnoGuard::ClearErrnoGuard
              ((ClearErrnoGuard *)((long)&result + 4));
    __ptr = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    __n_00 = fwrite(__ptr,1,__n,(FILE *)this->output_);
    if (__n_00 == 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        piVar3 = __errno_location();
        if (*piVar3 == 0) {
          iVar2 = ferror((FILE *)this->output_);
          if (iVar2 != 0) {
            this->error_ = 9;
          }
        }
        else {
          piVar3 = __errno_location();
          this->error_ = *piVar3;
        }
      }
    }
    else {
      this->count_ = __n_00 + this->count_;
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,__n_00);
    }
    str_format_internal::anon_unknown_0::ClearErrnoGuard::~ClearErrnoGuard
              ((ClearErrnoGuard *)((long)&result + 4));
  }
  return;
}

Assistant:

void FILERawSink::Write(string_view v) {
  while (!v.empty() && !error_) {
    // Reset errno to zero in case the libc implementation doesn't set errno
    // when a failure occurs.
    ClearErrnoGuard guard;

    if (size_t result = std::fwrite(v.data(), 1, v.size(), output_)) {
      // Some progress was made.
      count_ += result;
      v.remove_prefix(result);
    } else {
      if (errno == EINTR) {
        continue;
      } else if (errno) {
        error_ = errno;
      } else if (std::ferror(output_)) {
        // Non-POSIX compliant libc implementations may not set errno, so we
        // have check the streams error indicator.
        error_ = EBADF;
      } else {
        // We're likely on a non-POSIX system that encountered EINTR but had no
        // way of reporting it.
        continue;
      }
    }
  }
}